

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMig.h
# Opt level: O2

int Mig_ObjIsCi(Mig_Obj_t *p)

{
  uint uVar1;
  
  uVar1 = 0;
  if ((0xfffffffd < (uint)p->pFans[1]) && ((uint)p->pFans[2] < 0xfffffffe)) {
    uVar1 = (uint)(0xfffffffd < (uint)p->pFans[0]);
  }
  return uVar1;
}

Assistant:

static inline int          Mig_ObjIsCi( Mig_Obj_t * p )                        { return Mig_ObjIsTerm(p) &&  Mig_FanIsNone( p, 0 );         }